

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

bool duckdb::VectorCastHelpers::TryCastLoop<duckdb::hugeint_t,unsigned_short,duckdb::NumericTryCast>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  bool bVar1;
  
  bVar1 = TemplatedTryCastLoop<duckdb::hugeint_t,unsigned_short,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
                    (source,result,count,parameters);
  return bVar1;
}

Assistant:

static bool TryCastLoop(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
		return TemplatedTryCastLoop<SRC, DST, VectorTryCastOperator<OP>>(source, result, count, parameters);
	}